

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

Xt __thiscall cppforth::Forth::findDefinition(Forth *this,CAddr nameToFind,Cell nameLength)

{
  Xt XVar1;
  string Word1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (nameLength == 0) {
    XVar1 = 0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_48,(ulong)nameLength,' ');
    moveFromDataSpace(this,&local_48,nameToFind,(ulong)nameLength);
    XVar1 = findDefinition(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return XVar1;
}

Assistant:

Xt findDefinition(CAddr nameToFind, Cell nameLength) {
			if (nameLength == 0)
				return 0;
			std::string Word1(nameLength,' ');
			moveFromDataSpace(Word1, nameToFind, nameLength);
			return findDefinition(Word1);
			/* for (auto & c: Word1) c = toupper_ascii(static_cast<unsigned char>(c));
			for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
				auto& defn = *i;
				//if (!defn.isFindable())
				if (defn.isHidden())
					continue;
				auto& name = defn.name;
				if(nameLength==name.length() && Word1.compare(name)==0) {
					return defn.numberInVector; 
				}
			}
			return 0; */
		}